

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

void __thiscall
llvm::yaml::Output::Output(Output *this,raw_ostream *yout,void *context,int WrapColumn)

{
  int WrapColumn_local;
  void *context_local;
  raw_ostream *yout_local;
  Output *this_local;
  
  IO::IO(&this->super_IO,context);
  (this->super_IO)._vptr_IO = (_func_int **)&PTR__Output_030a5460;
  this->Out = yout;
  this->WrapColumn = WrapColumn;
  SmallVector<llvm::yaml::Output::InState,_8U>::SmallVector(&this->StateStack);
  this->Column = 0;
  this->ColumnAtFlowStart = 0;
  this->ColumnAtMapFlowStart = 0;
  this->NeedBitValueComma = false;
  this->NeedFlowSequenceComma = false;
  this->EnumerationMatchFound = false;
  this->WriteDefaultValues = false;
  StringRef::StringRef(&this->Padding);
  StringRef::StringRef(&this->PaddingBeforeContainer);
  return;
}

Assistant:

Output::Output(raw_ostream &yout, void *context, int WrapColumn)
    : IO(context), Out(yout), WrapColumn(WrapColumn) {}